

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

void DoRemove(AActor *removetarget,int flags,PClassActor *filter,FName *species)

{
  AActor *mo;
  uint uVar1;
  bool bVar2;
  bool local_54;
  TFlags<ActorFlag,_unsigned_int> local_40;
  TFlags<ActorFlag3,_unsigned_int> local_3c;
  TFlags<ActorFlag,_unsigned_int> local_38;
  TFlags<ActorFlag3,_unsigned_int> local_34;
  FName local_30;
  undefined1 local_2a;
  byte local_29;
  bool speciespass;
  FName *pFStack_28;
  bool filterpass;
  FName *species_local;
  PClassActor *filter_local;
  AActor *pAStack_10;
  int flags_local;
  AActor *removetarget_local;
  
  pFStack_28 = species;
  species_local = (FName *)filter;
  filter_local._4_4_ = flags;
  pAStack_10 = removetarget;
  local_29 = DoCheckClass(removetarget,filter,(flags & 0x10U) != 0);
  mo = pAStack_10;
  FName::FName(&local_30,species);
  local_2a = DoCheckSpecies(mo,&local_30,(filter_local._4_4_ & 0x20) != 0);
  if ((filter_local._4_4_ & 0x40) == 0) {
    if ((local_29 & 1) == 0) {
      return;
    }
  }
  else if ((local_29 & 1) != 0) goto LAB_00533eb0;
  if (!(bool)local_2a) {
    return;
  }
LAB_00533eb0:
  if ((filter_local._4_4_ & 8) != 0) {
    P_RemoveThing(pAStack_10);
  }
  bVar2 = false;
  if ((filter_local._4_4_ & 4) != 0) {
    TFlags<ActorFlag3,_unsigned_int>::operator&
              (&local_34,
               (int)pAStack_10 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
    uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_34);
    bVar2 = false;
    if (uVar1 != 0) {
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_38,
                 (int)pAStack_10 +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_38);
      bVar2 = uVar1 != 0;
    }
    bVar2 = (bool)(bVar2 ^ 1);
  }
  if (bVar2) {
    P_RemoveThing(pAStack_10);
  }
  TFlags<ActorFlag3,_unsigned_int>::operator&
            (&local_3c,
             (int)pAStack_10 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
  uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_3c);
  if (uVar1 != 0 && (filter_local._4_4_ & 2) == 0) {
    P_RemoveThing(pAStack_10);
  }
  TFlags<ActorFlag,_unsigned_int>::operator&
            (&local_40,
             (int)pAStack_10 +
             (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
  uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_40);
  local_54 = uVar1 != 0 && (filter_local._4_4_ & 1) != 0;
  if (local_54) {
    P_RemoveThing(pAStack_10);
  }
  return;
}

Assistant:

static void DoRemove(AActor *removetarget, int flags, PClassActor *filter, FName species)
{
	bool filterpass = DoCheckClass(removetarget, filter, !!(flags & RMVF_EXFILTER)),
		speciespass = DoCheckSpecies(removetarget, species, !!(flags & RMVF_EXSPECIES));
	if ((flags & RMVF_EITHER) ? (filterpass || speciespass) : (filterpass && speciespass))
	{
		if ((flags & RMVF_EVERYTHING))
		{
			P_RemoveThing(removetarget);
		}
		if ((flags & RMVF_MISC) && !((removetarget->flags3 & MF3_ISMONSTER) && (removetarget->flags & MF_MISSILE)))
		{
			P_RemoveThing(removetarget);
		}
		if ((removetarget->flags3 & MF3_ISMONSTER) && !(flags & RMVF_NOMONSTERS))
		{
			P_RemoveThing(removetarget);
		}
		if ((removetarget->flags & MF_MISSILE) && (flags & RMVF_MISSILES))
		{
			P_RemoveThing(removetarget);
		}
	}
}